

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O3

void psh_hint_table_activate_mask(PSH_Hint_Table table,PS_Mask hint_mask)

{
  uint uVar1;
  int iVar2;
  PSH_Hint_conflict pPVar3;
  PSH_Hint_conflict *ppPVar4;
  FT_UInt *pFVar5;
  byte *in_RDX;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar7 = table->max_hints;
  if (uVar7 != 0) {
    pFVar5 = &table->hints->flags;
    uVar8 = uVar7;
    do {
      *(byte *)pFVar5 = (byte)*pFVar5 & 0xfb;
      pFVar5[4] = -1;
      pFVar5 = pFVar5 + 0xc;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if ((int)hint_mask == 0) {
    table->num_hints = 0;
  }
  else {
    lVar9 = 0;
    uVar12 = 0;
    uVar10 = 0;
    uVar8 = 0;
    do {
      if (uVar12 == 0) {
        uVar10 = (uint)*in_RDX;
        in_RDX = in_RDX + 1;
        uVar12 = 0x80;
      }
      if ((uVar12 & uVar10) != 0) {
        pPVar3 = table->hints;
        uVar1 = *(uint *)((long)&pPVar3->flags + lVar9);
        if (((uVar1 & 4) == 0) &&
           (*(uint *)((long)&pPVar3->flags + lVar9) = uVar1 | 4, uVar8 < uVar7)) {
          uVar6 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
          table->sort[uVar6] = (PSH_Hint_conflict)((long)&pPVar3->org_pos + lVar9);
        }
      }
      uVar12 = uVar12 >> 1;
      lVar9 = lVar9 + 0x30;
    } while (((ulong)hint_mask & 0xffffffff) * 0x30 != lVar9);
    table->num_hints = uVar8;
    if (1 < uVar8) {
      ppPVar4 = table->sort;
      uVar6 = 1;
      uVar7 = 0xffffffff;
      do {
        pPVar3 = ppPVar4[uVar6];
        iVar2 = pPVar3->org_pos;
        uVar10 = uVar7;
        do {
          uVar11 = (ulong)uVar10;
          if (ppPVar4[uVar10 + 1]->org_pos < iVar2) break;
          ppPVar4[uVar10 + 2] = ppPVar4[uVar10 + 1];
          ppPVar4[uVar10 + 1] = pPVar3;
          uVar10 = uVar10 - 1;
        } while (uVar11 < uVar6);
        uVar6 = uVar6 + 1;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar8);
    }
  }
  return;
}

Assistant:

static void
  psh_hint_table_activate_mask( PSH_Hint_Table  table,
                                PS_Mask         hint_mask )
  {
    FT_Int    mask = 0, val = 0;
    FT_Byte*  cursor = hint_mask->bytes;
    FT_UInt   idx, limit, count;


    limit = hint_mask->num_bits;
    count = 0;

    psh_hint_table_deactivate( table );

    for ( idx = 0; idx < limit; idx++ )
    {
      if ( mask == 0 )
      {
        val  = *cursor++;
        mask = 0x80;
      }

      if ( val & mask )
      {
        PSH_Hint  hint = &table->hints[idx];


        if ( !psh_hint_is_active( hint ) )
        {
          FT_UInt     count2;

#if 0
          PSH_Hint*  sort = table->sort;
          PSH_Hint   hint2;


          for ( count2 = count; count2 > 0; count2--, sort++ )
          {
            hint2 = sort[0];
            if ( psh_hint_overlap( hint, hint2 ) )
              FT_TRACE0(( "psh_hint_table_activate_mask:"
                          " found overlapping hints\n" ))
          }
#else
          count2 = 0;
#endif

          if ( count2 == 0 )
          {
            psh_hint_activate( hint );
            if ( count < table->max_hints )
              table->sort[count++] = hint;
            else
              FT_TRACE0(( "psh_hint_tableactivate_mask:"
                          " too many active hints\n" ));
          }
        }
      }

      mask >>= 1;
    }
    table->num_hints = count;

    /* now, sort the hints; they are guaranteed to not overlap */
    /* so we can compare their "org_pos" field directly        */
    {
      FT_UInt    i1, i2;
      PSH_Hint   hint1, hint2;
      PSH_Hint*  sort = table->sort;


      /* a simple bubble sort will do, since in 99% of cases, the hints */
      /* will be already sorted -- and the sort will be linear          */
      for ( i1 = 1; i1 < count; i1++ )
      {
        hint1 = sort[i1];
        /* this loop stops when i2 wraps around after reaching 0 */
        for ( i2 = i1 - 1; i2 < i1; i2-- )
        {
          hint2 = sort[i2];

          if ( hint2->org_pos < hint1->org_pos )
            break;

          sort[i2 + 1] = hint2;
          sort[i2]     = hint1;
        }
      }
    }
  }